

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

char * arg_resolve_env(char *str)

{
  char *pcVar1;
  char *local_a8;
  char *j;
  char *i;
  size_t alloced;
  char *env_val;
  char env_name [100];
  char *local_18;
  char *resolved_str;
  char *str_local;
  
  local_18 = (char *)0x0;
  i = (char *)0x0;
  j = str;
  resolved_str = str;
  do {
    pcVar1 = strstr(j,"$(");
    if (pcVar1 == (char *)0x0) {
      strappend(&local_18,(size_t *)&i,j);
      local_a8 = (char *)0x0;
    }
    else {
      if (pcVar1 != j) {
        strnappend(&local_18,(size_t *)&i,j,(long)pcVar1 - (long)j);
        j = pcVar1;
      }
      local_a8 = strchr(j + 2,0x29);
      if (local_a8 == (char *)0x0) {
        local_a8 = j + 2;
        strnappend(&local_18,(size_t *)&i,j,(long)local_a8 - (long)j);
        j = local_a8;
      }
      else {
        if ((long)local_a8 - (long)(j + 2) < 100) {
          strncpy((char *)&env_val,j + 2,(long)local_a8 - (long)(j + 2));
          local_a8[(long)(env_name + (-8 - (long)(j + 2)))] = '\0';
          alloced = (size_t)getenv((char *)&env_val);
          if ((char *)alloced != (char *)0x0) {
            strappend(&local_18,(size_t *)&i,(char *)alloced);
          }
        }
        j = local_a8 + 1;
      }
    }
  } while (local_a8 != (char *)0x0);
  return local_18;
}

Assistant:

static char*
arg_resolve_env(const char *str)
{
    char *resolved_str = NULL;
    char env_name[100];
    const char *env_val;
    size_t alloced = 0;
    const char *i = str, *j;

    /* calculate required resolved_str size */
    do {
        j = strstr(i, "$(");
        if (j != NULL) {
            if (j != i) {
                strnappend(&resolved_str, &alloced, i, j - i);
                i = j;
            }
            j = strchr(i + 2, ')');
            if (j != NULL) {
                if (j - (i + 2) < 100) {
                    strncpy(env_name, i + 2, j - (i + 2));
                    env_name[j - (i + 2)] = '\0';
                    #if !defined(_WIN32_WCE)
                    env_val = getenv(env_name);
                    if (env_val)
                        strappend(&resolved_str, &alloced, env_val);
                    #else
                    env_val = 0;
                    #endif
                }
                i = j + 1;
            } else {
                /* unclosed, copy and skip */
                j = i + 2;
                strnappend(&resolved_str, &alloced, i, j - i);
                i = j;
            }
        } else {
            strappend(&resolved_str, &alloced, i);
        }
    } while(j != NULL);

    return resolved_str;
}